

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Field::InternalSwap(Field *this,Field *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  ArenaStringPtr *pAVar2;
  bool bVar3;
  string *psVar4;
  int iVar5;
  int32 iVar6;
  int32 iVar7;
  int iVar8;
  int iVar9;
  int32 iVar10;
  int32 iVar11;
  UnknownFieldSet *other_00;
  Arena *pAVar12;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      other_00 = internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  }
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->options_).super_RepeatedPtrFieldBase,
             &(other->options_).super_RepeatedPtrFieldBase);
  pAVar1 = &this->name_;
  pAVar12 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->name_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_003047a3;
    }
  }
  else {
LAB_003047a3:
    psVar4 = pAVar1->ptr_;
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar4);
  }
  pAVar1 = &this->type_url_;
  pAVar12 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->type_url_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_003047f9;
    }
  }
  else {
LAB_003047f9:
    psVar4 = pAVar1->ptr_;
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar4);
  }
  pAVar1 = &this->json_name_;
  pAVar12 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->json_name_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_0030484f;
    }
  }
  else {
LAB_0030484f:
    psVar4 = pAVar1->ptr_;
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar4);
  }
  pAVar1 = &this->default_value_;
  pAVar12 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->default_value_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_003048d4;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar4 = pAVar1->ptr_;
  if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar2,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar4);
LAB_003048d4:
  iVar8 = this->kind_;
  iVar9 = this->cardinality_;
  iVar10 = this->number_;
  iVar11 = this->oneof_index_;
  iVar5 = other->cardinality_;
  iVar6 = other->number_;
  iVar7 = other->oneof_index_;
  this->kind_ = other->kind_;
  this->cardinality_ = iVar5;
  this->number_ = iVar6;
  this->oneof_index_ = iVar7;
  other->kind_ = iVar8;
  other->cardinality_ = iVar9;
  other->number_ = iVar10;
  other->oneof_index_ = iVar11;
  bVar3 = this->packed_;
  this->packed_ = other->packed_;
  other->packed_ = bVar3;
  return;
}

Assistant:

void Field::InternalSwap(Field* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  options_.InternalSwap(&other->options_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  type_url_.Swap(&other->type_url_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  json_name_.Swap(&other->json_name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  default_value_.Swap(&other->default_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Field, packed_)
      + sizeof(Field::packed_)
      - PROTOBUF_FIELD_OFFSET(Field, kind_)>(
          reinterpret_cast<char*>(&kind_),
          reinterpret_cast<char*>(&other->kind_));
}